

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O3

int lj_trace_exit(jit_State *J,void *exptr)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  lua_State *L;
  long lVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int *piVar9;
  ptrdiff_t argbase;
  TValue *pTVar10;
  long lVar11;
  ulong uVar12;
  BCIns *pBVar13;
  ulong uVar14;
  ExitDataCP exd;
  jit_State *local_48;
  void *local_40;
  BCIns *local_38;
  
  uVar14 = 0xffffffff00000000;
  piVar9 = __errno_location();
  iVar8 = *piVar9;
  L = J->L;
  iVar3 = J->exitcode;
  if (iVar3 == 0) {
    uVar12 = 0;
  }
  else {
    J->exitcode = 0;
    uVar14 = L->top[-1].u64 & 0xffffffff00000000;
    uVar12 = L->top[-1].u64 & 0xffffffff;
  }
  local_48 = J;
  local_40 = exptr;
  iVar6 = lj_vm_cpcall(L,0,&local_48,trace_exit_cp);
  if (iVar6 != 0) {
LAB_0012ea61:
    return -iVar6;
  }
  if (iVar3 != 0) {
    pTVar10 = L->top;
    L->top = pTVar10 + 1;
    pTVar10->u64 = uVar12 | uVar14;
  }
  uVar14 = (ulong)(L->glref).ptr32;
  if (((-1 < *(char *)(uVar14 + 0x109)) && ((*(byte *)(uVar14 + 0x10b) & 8) != 0)) &&
     (argbase = lj_vmevent_prepare(L,LJ_VMEVENT_TEXIT), argbase != 0)) {
    pTVar10 = L->top;
    if ((long)((ulong)(L->maxstack).ptr32 - (long)pTVar10) < 0x1c1) {
      lj_state_growstack(L,0x38);
      pTVar10 = L->top;
    }
    L->top = pTVar10 + 1;
    pTVar10->n = (double)(int)J->parent;
    pTVar10 = L->top;
    L->top = pTVar10 + 1;
    pTVar10->n = (double)(int)J->exitno;
    pTVar10 = L->top;
    L->top = pTVar10 + 1;
    pTVar10->u64 = 0x4030000000000000;
    pTVar10 = L->top;
    L->top = pTVar10 + 1;
    pTVar10->u64 = 0x4030000000000000;
    lVar11 = 0;
    do {
      lVar5 = *(long *)((long)exptr + lVar11 * 8 + 0x80);
      pTVar10 = L->top;
      L->top = pTVar10 + 1;
      pTVar10->n = (double)lVar5;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x10);
    pTVar10 = L->top;
    lVar11 = 0;
    do {
      *pTVar10 = *(TValue *)((long)exptr + lVar11 * 8);
      pTVar10 = L->top;
      if (NAN(pTVar10->n)) {
        pTVar10->u64 = 0xfff8000000000000;
        pTVar10 = L->top;
      }
      pTVar10 = pTVar10 + 1;
      L->top = pTVar10;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x10);
    lj_vmevent_call(L,argbase);
  }
  uVar14 = (ulong)L->cframe & 0xfffffffffffffffc;
  *(int *)(uVar14 + 0x1c) = (int)local_38;
  if (iVar3 != 0) {
    return -iVar3;
  }
  uVar12 = (ulong)(L->glref).ptr32;
  bVar1 = *(byte *)(uVar12 + 0x109);
  if (-1 < (char)bVar1) {
    cVar2 = *(char *)(uVar12 + 0x59);
    if ((cVar2 == '\x05') || (cVar2 == '\x02')) {
      if ((bVar1 < 0x40) && (iVar6 = lj_vm_cpcall(L,0,0,trace_exit_gc_cp), iVar6 != 0))
      goto LAB_0012ea61;
    }
    else if ((J->flags & 1) != 0) {
      trace_hotside(J,local_38);
    }
  }
  uVar7 = *local_38;
  pBVar13 = local_38;
  if (((char)uVar7 == 'W') &&
     (uVar12 = (ulong)J->trace[uVar7 >> 0x10].gcptr32, 0xfffffffb < *(byte *)(uVar12 + 0x38) - 0x4d)
     ) {
    pBVar13 = (BCIns *)(uVar12 + 0x38);
    if (J->state == LJ_TRACE_RECORD) {
      J->patchins = uVar7;
      J->patchpc = local_38;
      *local_38 = *pBVar13;
      J->bcskip = '\x01';
      pBVar13 = local_38;
    }
    else {
      *(int *)(uVar14 + 0x1c) = (int)pBVar13;
    }
  }
  *piVar9 = iVar8;
  uVar4 = *pBVar13;
  uVar7 = (uVar4 & 0xff) - 0x3f;
  uVar7 = uVar7 >> 1 | (uint)((uVar7 & 1) != 0) << 0x1f;
  if (uVar7 - 1 < 2) {
    return (int)((ulong)((long)L->top - (long)L->base) >> 3) -
           ((uVar4 >> 0x10 & 0xff) + (uVar4 >> 8 & 0xff));
  }
  if (uVar7 == 0) {
    iVar8 = (int)((ulong)((long)L->top - (long)L->base) >> 3);
    uVar7 = uVar4 >> 8 & 0xff;
  }
  else {
    if (uVar7 != 5) {
      if ((uVar4 & 0xff) < 0x59) {
        return 0;
      }
      iVar8 = (int)((ulong)((long)L->top - (long)L->base) >> 3);
      goto LAB_0012ece2;
    }
    iVar8 = (int)((ulong)((long)L->top - (long)L->base) >> 3);
    uVar7 = (uVar4 >> 0x10) + (uVar4 >> 8 & 0xff);
  }
  iVar8 = iVar8 - uVar7;
LAB_0012ece2:
  return iVar8 + 1;
}

Assistant:

int LJ_FASTCALL lj_trace_exit(jit_State *J, void *exptr)
{
  ERRNO_SAVE
  lua_State *L = J->L;
  ExitState *ex = (ExitState *)exptr;
  ExitDataCP exd;
  int errcode, exitcode = J->exitcode;
  TValue exiterr;
  const BCIns *pc;
  void *cf;
  GCtrace *T;

  setnilV(&exiterr);
  if (exitcode) {  /* Trace unwound with error code. */
    J->exitcode = 0;
    copyTV(L, &exiterr, L->top-1);
  }

#ifdef EXITSTATE_PCREG
  J->parent = trace_exit_find(J, (MCode *)(intptr_t)ex->gpr[EXITSTATE_PCREG]);
#endif
  T = traceref(J, J->parent); UNUSED(T);
#ifdef EXITSTATE_CHECKEXIT
  if (J->exitno == T->nsnap) {  /* Treat stack check like a parent exit. */
    lj_assertJ(T->root != 0, "stack check in root trace");
    J->exitno = T->ir[REF_BASE].op2;
    J->parent = T->ir[REF_BASE].op1;
    T = traceref(J, J->parent);
  }
#endif
  lj_assertJ(T != NULL && J->exitno < T->nsnap, "bad trace or exit number");
  exd.J = J;
  exd.exptr = exptr;
  errcode = lj_vm_cpcall(L, NULL, &exd, trace_exit_cp);
  if (errcode)
    return -errcode;  /* Return negated error code. */

  if (exitcode) copyTV(L, L->top++, &exiterr);  /* Anchor the error object. */

  if (!(LJ_HASPROFILE && (G(L)->hookmask & HOOK_PROFILE)))
    lj_vmevent_send(L, TEXIT,
      lj_state_checkstack(L, 4+RID_NUM_GPR+RID_NUM_FPR+LUA_MINSTACK);
      setintV(L->top++, J->parent);
      setintV(L->top++, J->exitno);
      trace_exit_regs(L, ex);
    );

  pc = exd.pc;
  cf = cframe_raw(L->cframe);
  setcframe_pc(cf, pc);
  if (exitcode) {
    return -exitcode;
  } else if (LJ_HASPROFILE && (G(L)->hookmask & HOOK_PROFILE)) {
    /* Just exit to interpreter. */
  } else if (G(L)->gc.state == GCSatomic || G(L)->gc.state == GCSfinalize) {
    if (!(G(L)->hookmask & HOOK_GC)) {
      /* Exited because of GC: drive GC forward. */
      errcode = lj_vm_cpcall(L, NULL, NULL, trace_exit_gc_cp);
      if (errcode)
	return -errcode;  /* Return negated error code. */
    }
  } else if ((J->flags & JIT_F_ON)) {
    trace_hotside(J, pc);
  }
  if (bc_op(*pc) == BC_JLOOP) {
    BCIns *retpc = &traceref(J, bc_d(*pc))->startins;
    if (bc_isret(bc_op(*retpc))) {
      if (J->state == LJ_TRACE_RECORD) {
	J->patchins = *pc;
	J->patchpc = (BCIns *)pc;
	*J->patchpc = *retpc;
	J->bcskip = 1;
      } else {
	pc = retpc;
	setcframe_pc(cf, pc);
      }
    }
  }
  /* Return MULTRES or 0. */
  ERRNO_RESTORE
  switch (bc_op(*pc)) {
  case BC_CALLM: case BC_CALLMT:
    return (int)((BCReg)(L->top - L->base) - bc_a(*pc) - bc_c(*pc) - LJ_FR2);
  case BC_RETM:
    return (int)((BCReg)(L->top - L->base) + 1 - bc_a(*pc) - bc_d(*pc));
  case BC_TSETM:
    return (int)((BCReg)(L->top - L->base) + 1 - bc_a(*pc));
  default:
    if (bc_op(*pc) >= BC_FUNCF)
      return (int)((BCReg)(L->top - L->base) + 1);
    return 0;
  }
}